

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kit.h
# Opt level: O2

int Kit_TruthCountOnes(uint *pIn,int nVars)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  
  uVar1 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
  if (nVars < 6) {
    uVar1 = 1;
  }
  iVar3 = 0;
  for (; 0 < (int)uVar1; uVar1 = uVar1 - 1) {
    uVar2 = (pIn[uVar1 - 1] >> 1 & 0x55555555) + (pIn[uVar1 - 1] & 0x55555555);
    uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333);
    uVar2 = (uVar2 >> 4 & 0x7070707) + (uVar2 & 0x7070707);
    uVar2 = (uVar2 >> 8 & 0xf000f) + (uVar2 & 0xf000f);
    iVar3 = (uVar2 >> 0x10) + iVar3 + (uVar2 & 0xffff);
  }
  return iVar3;
}

Assistant:

static inline int Kit_TruthCountOnes( unsigned * pIn, int nVars )
{
    int w, Counter = 0;
    for ( w = Kit_TruthWordNum(nVars)-1; w >= 0; w-- )
        Counter += Kit_WordCountOnes(pIn[w]);
    return Counter;
}